

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoundationPileColliderTests.cpp
# Opt level: O3

void __thiscall
solitaire::colliders::FoundationPileColliderTests_collidesWithPoint_Test::
~FoundationPileColliderTests_collidesWithPoint_Test
          (FoundationPileColliderTests_collidesWithPoint_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TEST_F(FoundationPileColliderTests, collidesWithPoint) {
    EXPECT_FALSE(collider.collidesWithPoint(topLeftCorner - Position {1, 0}));
    EXPECT_FALSE(collider.collidesWithPoint(topLeftCorner - Position {0, 1}));
    EXPECT_FALSE(collider.collidesWithPoint(bottomRightCorner + Position {1, 0}));
    EXPECT_FALSE(collider.collidesWithPoint(bottomRightCorner + Position {0, 1}));
    EXPECT_TRUE(collider.collidesWithPoint(topLeftCorner));
    EXPECT_TRUE(collider.collidesWithPoint(bottomRightCorner));
}